

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O0

void HighsRedcostFixing::propagateRedCost
               (HighsMipSolver *mipsolver,HighsDomain *localdomain,HighsLpRelaxation *lp)

{
  double dVar1;
  anon_class_8_1_82c2224f_for__M_pred __pred;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  bool bVar2;
  HighsInt HVar3;
  HighsSolution *pHVar4;
  pointer pHVar5;
  double *pdVar6;
  reference piVar7;
  reference pvVar8;
  const_reference pvVar9;
  size_type sVar10;
  HighsLpRelaxation *in_RDX;
  HighsDomain *in_RSI;
  double dVar11;
  HighsCDouble HVar12;
  HighsDomainChange *domchg_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *__range3_1;
  HighsDomainChange *domchg_1;
  iterator __end4;
  iterator __begin4;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *__range4;
  HighsDomainChange *domchg;
  iterator __end3;
  iterator __begin3;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *__range3;
  HighsInt oldNumConflicts;
  bool addedConstraints;
  double rhs;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> inds;
  double newlb;
  double newub;
  double maxIncrease;
  HighsInt col;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> boundChanges;
  double tolerance;
  HighsCDouble gap;
  double lpobjective;
  vector<double,_std::allocator<double>_> *lpredcost;
  undefined4 in_stack_fffffffffffffb58;
  HighsInt in_stack_fffffffffffffb5c;
  undefined6 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb66;
  undefined1 in_stack_fffffffffffffb67;
  HighsDomainChange *in_stack_fffffffffffffb68;
  Reason in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  Reason in_stack_fffffffffffffb80;
  const_iterator in_stack_fffffffffffffb88;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_fffffffffffffb90;
  HighsLpRelaxation *in_stack_fffffffffffffbf8;
  HighsLpRelaxation *this;
  Reason in_stack_fffffffffffffc00;
  undefined6 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0e;
  undefined1 in_stack_fffffffffffffc0f;
  HighsDomain *in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffcbc;
  undefined1 extractCliques;
  HighsDomain *in_stack_fffffffffffffcc0;
  Reason in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  HighsDomain *in_stack_fffffffffffffcd8;
  HighsDomain *in_stack_fffffffffffffce0;
  HighsLpRelaxation *in_stack_fffffffffffffce8;
  HighsInt *in_stack_fffffffffffffcf0;
  HighsDomainChange *in_stack_fffffffffffffcf8;
  HighsLpRelaxation *in_stack_fffffffffffffd00;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_270;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_268;
  Reason local_260;
  double local_258;
  undefined8 uStack_250;
  reference local_248;
  HighsDomainChange *local_240;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_238;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_230;
  HighsDomainChange *local_228;
  HighsDomainChange *local_220;
  HighsDomain *local_210;
  iterator in_stack_fffffffffffffdf8;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_1d8;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_1d0;
  HighsInt local_1c8;
  undefined1 local_1c1;
  vector<int,_std::allocator<int>_> local_1a0;
  Reason local_188;
  double local_180;
  int local_178;
  undefined4 local_174;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  HighsCDouble local_140;
  double local_130;
  double local_128;
  double local_120;
  int local_114;
  Reason local_110;
  HighsDomain *local_108;
  int local_100;
  undefined4 local_fc;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  HighsLpRelaxation *local_d8;
  HighsDomainChange *local_d0;
  HighsCDouble local_c8;
  HighsDomain *local_b8;
  double local_b0;
  int local_a4;
  int *local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  vector<int,_std::allocator<int>_> *local_90;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> local_78;
  double local_60;
  double local_58;
  double local_50;
  HighsCDouble local_48;
  HighsCDouble local_38;
  double local_28;
  vector<double,_std::allocator<double>_> *local_20;
  HighsLpRelaxation *local_18;
  HighsDomain *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pHVar4 = HighsLpRelaxation::getSolution((HighsLpRelaxation *)0x68a0fc);
  local_20 = &pHVar4->col_dual;
  local_28 = HighsLpRelaxation::getObjective(local_18);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68a132);
  HighsCDouble::HighsCDouble(&local_48,pHVar5->upper_limit);
  HVar12 = HighsCDouble::operator-
                     ((HighsCDouble *)
                      CONCAT17(in_stack_fffffffffffffb67,
                               CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                      (double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  local_38.lo = HVar12.lo;
  local_38.hi = HVar12.hi;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68a18b);
  local_58 = pHVar5->feastol * 10.0;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68a1bc);
  dVar11 = pHVar5->epsilon;
  local_60 = HighsCDouble::operator_cast_to_double(&local_38);
  local_60 = dVar11 * local_60;
  pdVar6 = std::max<double>(&local_58,&local_60);
  local_50 = *pdVar6;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::vector
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)0x68a22a);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68a23e);
  std::vector<int,_std::allocator<int>_>::size(&pHVar5->integral_cols);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::reserve
            (in_stack_fffffffffffffb90,(size_type)in_stack_fffffffffffffb88._M_current);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68a273);
  local_90 = &pHVar5->integral_cols;
  local_98._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  local_a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffb67,
                                CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    extractCliques = (undefined1)((uint)in_stack_fffffffffffffcbc >> 0x18);
    if (!bVar2) break;
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_98);
    local_a4 = *piVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_10->col_upper_,(long)local_a4);
    dVar11 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_10->col_lower_,(long)local_a4);
    if (((dVar11 != *pvVar8) || (NAN(dVar11) || NAN(*pvVar8))) &&
       (pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_a4),
       local_50 < (double)((ulong)*pvVar9 & (ulong)DAT_008704e0))) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_a4);
      dVar11 = *pvVar9;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_10->col_upper_,(long)local_a4);
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_10->col_lower_,(long)local_a4);
      local_b0 = dVar11 * (dVar1 - *pvVar8);
      bVar2 = operator>((double)CONCAT17(in_stack_fffffffffffffb67,
                                         CONCAT16(in_stack_fffffffffffffb66,
                                                  in_stack_fffffffffffffb60)),
                        (HighsCDouble *)
                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      if (bVar2) {
        std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_a4);
        HVar12 = HighsCDouble::operator/
                           ((HighsCDouble *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                            3.38822216054464e-317);
        local_f0 = HVar12.lo;
        local_f8 = HVar12.hi;
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_10->col_lower_,(long)local_a4);
        HVar12 = HighsCDouble::operator+
                           ((HighsCDouble *)
                            CONCAT17(in_stack_fffffffffffffb67,
                                     CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                            (double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        local_e0 = HVar12.lo;
        local_e8 = HVar12.hi;
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x68a51f);
        HVar12 = HighsCDouble::operator+
                           ((HighsCDouble *)
                            CONCAT17(in_stack_fffffffffffffb67,
                                     CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                            (double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        in_stack_fffffffffffffcf8 = (HighsDomainChange *)HVar12.lo;
        in_stack_fffffffffffffce8 = (HighsLpRelaxation *)HVar12.hi;
        in_stack_fffffffffffffd00 = in_stack_fffffffffffffce8;
        local_d8 = in_stack_fffffffffffffce8;
        local_d0 = in_stack_fffffffffffffcf8;
        in_stack_fffffffffffffcf0 = (HighsInt *)floor((double)in_stack_fffffffffffffcf8);
        local_c8.hi = (double)in_stack_fffffffffffffcf0;
        local_c8.lo = (double)in_stack_fffffffffffffce8;
        in_stack_fffffffffffffcd8 = (HighsDomain *)HighsCDouble::operator_cast_to_double(&local_c8);
        in_stack_fffffffffffffce0 = in_stack_fffffffffffffcd8;
        local_b8 = in_stack_fffffffffffffcd8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_10->col_upper_,(long)local_a4);
        if ((double)in_stack_fffffffffffffcd8 < *pvVar8) {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x68a631);
          in_stack_fffffffffffffcd7 =
               HighsDomain::isBinary
                         ((HighsDomain *)
                          CONCAT17(in_stack_fffffffffffffb67,
                                   CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                          in_stack_fffffffffffffb5c);
          if ((bool)in_stack_fffffffffffffcd7) {
            local_108 = local_b8;
            local_100 = local_a4;
            local_fc = 1;
            std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
            emplace_back<HighsDomainChange>
                      ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                       in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
          }
          else {
            in_stack_fffffffffffffcbc = local_a4;
            in_stack_fffffffffffffcc0 = local_b8;
            in_stack_fffffffffffffcc8 = HighsDomain::Reason::unspecified();
            local_110 = in_stack_fffffffffffffcc8;
            HighsDomain::changeBound
                      ((HighsDomain *)
                       CONCAT17(in_stack_fffffffffffffb7f,
                                CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                       in_stack_fffffffffffffb70.index,in_stack_fffffffffffffb70.type,
                       (double)in_stack_fffffffffffffb68,in_stack_fffffffffffffb80);
            bVar2 = HighsDomain::infeasible(local_10);
            if (bVar2) {
              local_114 = 1;
              goto LAB_0068b1db;
            }
          }
        }
      }
      else {
        HVar12 = HighsCDouble::operator-((HighsCDouble *)0x68a778);
        local_120 = HVar12.lo;
        local_128 = HVar12.hi;
        bVar2 = ::operator<((double)CONCAT17(in_stack_fffffffffffffb67,
                                             CONCAT16(in_stack_fffffffffffffb66,
                                                      in_stack_fffffffffffffb60)),
                            (HighsCDouble *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        if (bVar2) {
          std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_a4);
          HVar12 = HighsCDouble::operator/
                             ((HighsCDouble *)
                              CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                              3.38867620687317e-317);
          local_168 = HVar12.lo;
          local_170 = HVar12.hi;
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&local_10->col_upper_,(long)local_a4);
          HVar12 = HighsCDouble::operator+
                             ((HighsCDouble *)
                              CONCAT17(in_stack_fffffffffffffb67,
                                       CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)
                                      ),
                              (double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
          ;
          local_158 = HVar12.lo;
          local_160 = HVar12.hi;
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x68a8b6);
          HVar12 = HighsCDouble::operator-
                             ((HighsCDouble *)
                              CONCAT17(in_stack_fffffffffffffb67,
                                       CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)
                                      ),
                              (double)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
          ;
          local_148 = HVar12.lo;
          dVar11 = HVar12.hi;
          local_150 = dVar11;
          local_140.hi = ceil(local_148);
          local_140.lo = dVar11;
          dVar11 = HighsCDouble::operator_cast_to_double(&local_140);
          local_130 = dVar11;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_10->col_lower_,(long)local_a4);
          if (*pvVar8 < dVar11) {
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x68a9cc);
            bVar2 = HighsDomain::isBinary
                              ((HighsDomain *)
                               CONCAT17(in_stack_fffffffffffffb67,
                                        CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60
                                                )),in_stack_fffffffffffffb5c);
            if (bVar2) {
              local_180 = local_130;
              local_178 = local_a4;
              local_174 = 0;
              std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
              emplace_back<HighsDomainChange>
                        ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                         in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
            }
            else {
              in_stack_fffffffffffffc10 = local_10;
              local_188 = HighsDomain::Reason::unspecified();
              HighsDomain::changeBound
                        ((HighsDomain *)
                         CONCAT17(in_stack_fffffffffffffb7f,
                                  CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)),
                         in_stack_fffffffffffffb70.index,in_stack_fffffffffffffb70.type,
                         (double)in_stack_fffffffffffffb68,in_stack_fffffffffffffb80);
              in_stack_fffffffffffffc0f = HighsDomain::infeasible(local_10);
              if ((bool)in_stack_fffffffffffffc0f) {
                local_114 = 1;
                goto LAB_0068b1db;
              }
            }
          }
        }
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_98);
  }
  bVar2 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::empty
                    ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                     in_stack_fffffffffffffb70);
  if (!bVar2) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x68ab26);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x68ab33);
    sVar10 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(&local_78);
    if (sVar10 < 0x65) {
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x68ab6e);
      in_stack_fffffffffffffc00 = (Reason)&pHVar5->domain;
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x68ab90);
      in_stack_fffffffffffffc0e =
           HighsLpRelaxation::computeDualProof
                     (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                      (double)in_stack_fffffffffffffcd8,
                      (vector<int,_std::allocator<int>_> *)
                      CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                      (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc8,
                      (double *)in_stack_fffffffffffffcc0,(bool)extractCliques);
      in_stack_fffffffffffffbf8 = local_18;
      if (!(bool)in_stack_fffffffffffffc0e) goto LAB_0068b06e;
      local_1c1 = 0;
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x68abfd);
      local_1c8 = HighsConflictPool::getNumConflicts
                            ((HighsConflictPool *)
                             CONCAT17(in_stack_fffffffffffffb67,
                                      CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60))
                            );
      local_1d0 = &local_78;
      local_1d8._M_current =
           (HighsDomainChange *)
           std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin
                     ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
                ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      this = local_18;
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffb67,
                                            CONCAT16(in_stack_fffffffffffffb66,
                                                     in_stack_fffffffffffffb60)),
                                (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)),
            bVar2) {
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator*(&local_1d8);
        bVar2 = HighsDomain::isActive
                          ((HighsDomain *)in_stack_fffffffffffffb80,
                           (HighsDomainChange *)
                           CONCAT17(in_stack_fffffffffffffb7f,
                                    CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
        if (!bVar2) {
          std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x68ad1f);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x68ad31);
          std::vector<int,_std::allocator<int>_>::size(&local_1a0);
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x68ad70);
          HighsDomain::conflictAnalyzeReconvergence
                    ((HighsDomain *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     in_stack_fffffffffffffcf0,(double *)in_stack_fffffffffffffce8,
                     (HighsInt)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                     (double)in_stack_fffffffffffffcd8,
                     (HighsConflictPool *)
                     CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
        }
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator++(&local_1d8);
      }
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x68add1);
      HVar3 = HighsConflictPool::getNumConflicts
                        ((HighsConflictPool *)
                         CONCAT17(in_stack_fffffffffffffb67,
                                  CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)));
      local_1c1 = HVar3 != local_1c8;
      if (!(bool)local_1c1) {
LAB_0068af26:
        bVar2 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::empty
                          ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                           in_stack_fffffffffffffb70);
        if (!bVar2) {
          local_230 = &local_78;
          local_238._M_current =
               (HighsDomainChange *)
               std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin
                         ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          local_240 = (HighsDomainChange *)
                      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
                                ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffb67,
                                                CONCAT16(in_stack_fffffffffffffb66,
                                                         in_stack_fffffffffffffb60)),
                                    (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)
                                   ), bVar2) {
            local_248 = __gnu_cxx::
                        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                        ::operator*(&local_238);
            local_258 = local_248->boundval;
            uStack_250._0_4_ = local_248->column;
            uStack_250._4_4_ = local_248->boundtype;
            local_260 = HighsDomain::Reason::unspecified();
            boundchg.boundval._6_1_ = in_stack_fffffffffffffc0e;
            boundchg.boundval._0_6_ = in_stack_fffffffffffffc08;
            boundchg.boundval._7_1_ = in_stack_fffffffffffffc0f;
            boundchg._8_8_ = in_stack_fffffffffffffc10;
            HighsDomain::changeBound((HighsDomain *)this,boundchg,in_stack_fffffffffffffc00);
            bVar2 = HighsDomain::infeasible(local_10);
            if (bVar2) break;
            __gnu_cxx::
            __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
            ::operator++(&local_238);
          }
          bVar2 = HighsDomain::infeasible(local_10);
          if (!bVar2) {
            HighsDomain::propagate((HighsDomain *)in_stack_fffffffffffffdf8._M_current);
          }
        }
        goto LAB_0068b19c;
      }
      HighsDomain::propagate((HighsDomain *)in_stack_fffffffffffffdf8._M_current);
      bVar2 = HighsDomain::infeasible(local_10);
      if (!bVar2) {
        std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin
                  ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                   CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        in_stack_fffffffffffffdf8 =
             std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
                       ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        local_210 = local_10;
        __pred.localdomain._6_1_ = in_stack_fffffffffffffb7e;
        __pred.localdomain._0_6_ = in_stack_fffffffffffffb78;
        __pred.localdomain._7_1_ = in_stack_fffffffffffffb7f;
        std::
        remove_if<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,HighsRedcostFixing::propagateRedCost(HighsMipSolver_const&,HighsDomain&,HighsLpRelaxation_const&)::__0>
                  ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    )in_stack_fffffffffffffb88._M_current,
                   (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    )in_stack_fffffffffffffb80,__pred);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_const*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>
        ::__normal_iterator<HighsDomainChange*>
                  ((__normal_iterator<const_HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    *)CONCAT17(in_stack_fffffffffffffb67,
                               CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                   (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        local_220 = (HighsDomainChange *)
                    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
                              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_const*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>
        ::__normal_iterator<HighsDomainChange*>
                  ((__normal_iterator<const_HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    *)CONCAT17(in_stack_fffffffffffffb67,
                               CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                   (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        local_228 = (HighsDomainChange *)
                    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::erase
                              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                               CONCAT17(in_stack_fffffffffffffb7f,
                                        CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78
                                                )),in_stack_fffffffffffffb88,
                               (const_iterator)in_stack_fffffffffffffb80);
        goto LAB_0068af26;
      }
      local_114 = 1;
    }
    else {
LAB_0068b06e:
      local_268 = &local_78;
      local_270._M_current =
           (HighsDomainChange *)
           std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin
                     ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
                ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffb67,
                                            CONCAT16(in_stack_fffffffffffffb66,
                                                     in_stack_fffffffffffffb60)),
                                (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58)),
            bVar2) {
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator*(&local_270);
        in_stack_fffffffffffffb70 = HighsDomain::Reason::unspecified();
        boundchg_00.boundval._6_1_ = in_stack_fffffffffffffc0e;
        boundchg_00.boundval._0_6_ = in_stack_fffffffffffffc08;
        boundchg_00.boundval._7_1_ = in_stack_fffffffffffffc0f;
        boundchg_00._8_8_ = in_stack_fffffffffffffc10;
        HighsDomain::changeBound
                  ((HighsDomain *)in_stack_fffffffffffffbf8,boundchg_00,in_stack_fffffffffffffc00);
        in_stack_fffffffffffffb67 = HighsDomain::infeasible(local_10);
        if ((bool)in_stack_fffffffffffffb67) break;
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator++(&local_270);
      }
      bVar2 = HighsDomain::infeasible(local_10);
      if (!bVar2) {
        HighsDomain::propagate((HighsDomain *)in_stack_fffffffffffffdf8._M_current);
      }
LAB_0068b19c:
      local_114 = 0;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb70);
    if (local_114 != 0) goto LAB_0068b1db;
  }
  local_114 = 0;
LAB_0068b1db:
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::~vector
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
             in_stack_fffffffffffffb70);
  return;
}

Assistant:

void HighsRedcostFixing::propagateRedCost(const HighsMipSolver& mipsolver,
                                          HighsDomain& localdomain,
                                          const HighsLpRelaxation& lp) {
  const std::vector<double>& lpredcost = lp.getSolution().col_dual;
  double lpobjective = lp.getObjective();
  HighsCDouble gap =
      HighsCDouble(mipsolver.mipdata_->upper_limit) - lpobjective;

  double tolerance = std::max(10 * mipsolver.mipdata_->feastol,
                              mipsolver.mipdata_->epsilon * double(gap));

  assert(!localdomain.infeasible());
  std::vector<HighsDomainChange> boundChanges;
  boundChanges.reserve(mipsolver.mipdata_->integral_cols.size());
  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    // lpobj + (col - bnd) * redcost <= cutoffbound
    // (col - bnd) * redcost <= gap
    // redcost * col <= gap + redcost * bnd
    //   case bnd is upper bound  => redcost < 0 :
    //      col >= gap/redcost + ub
    //      <=> redcost < gap / (lb - ub)
    //   case bnd is lower bound  => redcost > 0 :
    //      col <= gap/redcost + lb
    //      <=> redcost > gap / (ub - lb)
    if (localdomain.col_upper_[col] == localdomain.col_lower_[col]) continue;
    if (std::fabs(lpredcost[col]) <= tolerance) continue;

    double maxIncrease = lpredcost[col] * (localdomain.col_upper_[col] -
                                           localdomain.col_lower_[col]);
    if (maxIncrease > gap) {
      assert(localdomain.col_lower_[col] != -kHighsInf);
      assert(lpredcost[col] > tolerance);
      double newub =
          double(floor(gap / lpredcost[col] + localdomain.col_lower_[col] +
                       mipsolver.mipdata_->feastol));
      if (newub >= localdomain.col_upper_[col]) continue;
      assert(newub < localdomain.col_upper_[col]);

      if (mipsolver.mipdata_->domain.isBinary(col)) {
        boundChanges.emplace_back(
            HighsDomainChange{newub, col, HighsBoundType::kUpper});
      } else {
        localdomain.changeBound(HighsBoundType::kUpper, col, newub,
                                HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) return;
      }
    } else if (maxIncrease < -gap) {
      assert(localdomain.col_upper_[col] != kHighsInf);
      assert(lpredcost[col] < -tolerance);
      double newlb =
          double(ceil(gap / lpredcost[col] + localdomain.col_upper_[col] -
                      mipsolver.mipdata_->feastol));

      if (newlb <= localdomain.col_lower_[col]) continue;
      assert(newlb > localdomain.col_lower_[col]);

      if (mipsolver.mipdata_->domain.isBinary(col)) {
        boundChanges.emplace_back(
            HighsDomainChange{newlb, col, HighsBoundType::kLower});
      } else {
        localdomain.changeBound(HighsBoundType::kLower, col, newlb,
                                HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) return;
      }
    }
  }

  if (!boundChanges.empty()) {
    std::vector<HighsInt> inds;
    std::vector<double> vals;
    double rhs;

    if (boundChanges.size() <= 100 &&
        lp.computeDualProof(mipsolver.mipdata_->domain,
                            mipsolver.mipdata_->upper_limit, inds, vals, rhs,
                            false)) {
      bool addedConstraints = false;

      HighsInt oldNumConflicts =
          mipsolver.mipdata_->conflictPool.getNumConflicts();
      for (const HighsDomainChange& domchg : boundChanges) {
        if (localdomain.isActive(domchg)) continue;
        localdomain.conflictAnalyzeReconvergence(
            domchg, inds.data(), vals.data(), inds.size(), rhs,
            mipsolver.mipdata_->conflictPool);
      }
      addedConstraints =
          mipsolver.mipdata_->conflictPool.getNumConflicts() != oldNumConflicts;

      if (addedConstraints) {
        localdomain.propagate();
        if (localdomain.infeasible()) return;

        boundChanges.erase(
            std::remove_if(boundChanges.begin(), boundChanges.end(),
                           [&](const HighsDomainChange& domchg) {
                             return localdomain.isActive(domchg);
                           }),
            boundChanges.end());
      }

      if (!boundChanges.empty()) {
        for (const HighsDomainChange& domchg : boundChanges) {
          localdomain.changeBound(domchg, HighsDomain::Reason::unspecified());
          if (localdomain.infeasible()) break;
        }

        if (!localdomain.infeasible()) localdomain.propagate();
      }
      // /printf("numConflicts: %d\n", numConflicts);
    } else {
      for (const HighsDomainChange& domchg : boundChanges) {
        localdomain.changeBound(domchg, HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) break;
      }

      if (!localdomain.infeasible()) localdomain.propagate();
    }
  }
}